

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall CVmObjStringBuffer::compare_str(CVmObjStringBuffer *this,char *str)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  vm_strbuf_ext *pvVar4;
  size_t sVar5;
  CVmObjStringBuffer *in_RDI;
  wchar_t c2;
  wchar_t c1;
  int32_t i;
  int32_t len2;
  int32_t len1;
  utf8_ptr p2;
  wchar_t *p1;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_34;
  wchar_t *local_20;
  
  pvVar4 = get_ext(in_RDI);
  local_20 = pvVar4->buf;
  utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (char *)in_RDI);
  pvVar4 = get_ext(in_RDI);
  iVar1 = pvVar4->len;
  vmb_get_len((char *)0x336f51);
  sVar5 = utf8_ptr::len((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (size_t)in_RDI);
  local_34 = 0;
  while( true ) {
    if (iVar1 <= local_34) {
      return iVar1 - (int)sVar5;
    }
    wVar2 = *local_20;
    wVar3 = utf8_ptr::getch((utf8_ptr *)0x336f89);
    if (wVar2 < wVar3) break;
    if (wVar3 < wVar2) {
      return 1;
    }
    local_34 = local_34 + 1;
    local_20 = local_20 + 1;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(wVar3,in_stack_ffffffffffffffc0));
  }
  return -1;
}

Assistant:

int CVmObjStringBuffer::compare_str(const char *str) const
{
    /* get the buffer pointers and character lengths */
    const wchar_t *p1 = get_ext()->buf;
    utf8_ptr p2((char *)str + VMB_LEN);
    int32_t len1 = get_ext()->len, len2 = p2.len(vmb_get_len(str));

    /* compare character by character */
    for (int32_t i = 0 ; i < len1 ; ++i, ++p1, p2.inc())
    {
        wchar_t c1 = *p1, c2 = p2.getch();
        if (c1 < c2)
            return -1;
        else if (c1 > c2)
            return 1;
    }

    /* 
     *   the strings are equal up to the length of the shorter string; the
     *   longer string compares higher 
     */
    return len1 - len2;
}